

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_begin_sb(telnet_t *telnet,uchar telopt)

{
  char local_14 [3];
  uchar local_11;
  uchar sb [3];
  telnet_t *ptStack_10;
  uchar telopt_local;
  telnet_t *telnet_local;
  
  local_14[0] = -1;
  local_14[1] = 0xfa;
  local_14[2] = telopt;
  local_11 = telopt;
  ptStack_10 = telnet;
  _send(telnet,local_14,3);
  return;
}

Assistant:

void telnet_begin_sb(telnet_t *telnet, unsigned char telopt) {
	unsigned char sb[3];
	sb[0] = TELNET_IAC;
	sb[1] = TELNET_SB;
	sb[2] = telopt;
	_sendu(telnet, sb, 3);
}